

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O3

void pzshape::TPZShapeQuad::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long *plVar5;
  long lVar6;
  bool bVar7;
  int transformation_index;
  int iVar8;
  bool bVar9;
  long lVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  TPZVec<double> *pt_00;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  TPZManVector<double,_1> outvec;
  TPZVec<long> ids;
  TPZFNMatrix<100,_double> phiblend;
  TPZFNMatrix<100,_double> dphiblend;
  REAL store1 [20];
  REAL store2 [40];
  TPZVec<double> local_b20;
  double local_b00;
  _func_int **local_af8;
  TPZVec<long> *local_af0;
  TPZVec<double> *local_ae8;
  _func_int **local_ae0;
  TPZFMatrix<double> local_ad8;
  TPZFMatrix<double> local_a48;
  _func_int **local_9b8;
  ulong local_9b0;
  TPZVec<long> local_9a8;
  TPZFMatrix<double> local_988;
  double local_8f8 [101];
  TPZFMatrix<double> local_5d0;
  double local_540 [101];
  double local_218 [20];
  double local_178 [41];
  
  local_af0 = id;
  local_ae8 = pt;
  ShapeCorner(pt,phi,dphi);
  local_988.fElem = local_8f8;
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 9;
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018379e0;
  local_988.fSize = 100;
  local_988.fGiven = local_988.fElem;
  TPZVec<int>::TPZVec(&local_988.fPivot.super_TPZVec<int>,0);
  local_988.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_988.fPivot.super_TPZVec<int>.fStore = local_988.fPivot.fExtAlloc;
  local_988.fPivot.super_TPZVec<int>.fNElements = 0;
  local_988.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_988.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_988.fWork.fStore = (double *)0x0;
  local_988.fWork.fNElements = 0;
  local_988.fWork.fNAlloc = 0;
  local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018376f0;
  local_5d0.fElem = local_540;
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 9;
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018379e0;
  local_5d0.fSize = 100;
  pt_00 = (TPZVec<double> *)&local_5d0.fPivot;
  local_5d0.fGiven = local_5d0.fElem;
  TPZVec<int>::TPZVec((TPZVec<int> *)pt_00,0);
  local_5d0.fPivot.super_TPZVec<int>.fStore = local_5d0.fPivot.fExtAlloc;
  local_ae0 = (_func_int **)&PTR__TPZManVector_01815498;
  local_5d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_5d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_5d0.fWork.fStore = (double *)0x0;
  local_5d0.fWork.fNElements = 0;
  local_5d0.fWork.fNAlloc = 0;
  local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018376f0;
  lVar16 = 0;
  do {
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
       (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_988.fElem[lVar16] = phi->fElem[lVar16];
    lVar19 = 0;
    bVar7 = true;
    do {
      bVar9 = bVar7;
      lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar15 <= lVar19) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)
         ) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar19) ||
         (local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar16)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_5d0.fElem[local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar16 + lVar19]
           = dphi->fElem[lVar15 * lVar16 + lVar19];
      lVar19 = 1;
      bVar7 = false;
    } while (bVar9);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  ShapeGenerating(pt_00,&local_988,&local_5d0);
  lVar16 = 4;
  local_9b8 = (_func_int **)&PTR__TPZManVector_018b7c18;
  local_af8 = (_func_int **)&PTR__TPZVec_01813f30;
  pp_Var11 = local_ae0;
  uVar14 = 0;
  do {
    dVar1 = (double)(&gRibTrans2dQ1d)[uVar14 * 2];
    dVar2 = (double)(&DAT_01a309a8)[uVar14 * 2];
    dVar3 = local_ae8->fStore[1];
    dVar4 = *local_ae8->fStore;
    TPZVec<long>::TPZVec(&local_9a8,2);
    TPZVec<double>::TPZVec(&local_b20,0);
    local_b00 = dVar1 * dVar4 + dVar2 * dVar3;
    local_b20._vptr_TPZVec = local_9b8;
    local_b20.fStore = &local_b00;
    local_b20.fNElements = 1;
    local_b20.fNAlloc = 0;
    plVar5 = local_af0->fStore;
    *local_9a8.fStore = plVar5[uVar14];
    local_9b0 = uVar14 + 1;
    local_9a8.fStore[1] = plVar5[(uint)local_9b0 & 3];
    iVar13 = order->fStore[uVar14];
    iVar17 = iVar13 + -1;
    lVar19 = (long)iVar17;
    local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018151d8;
    local_ad8.fElem = local_218;
    local_ad8.fSize = 0x14;
    local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar19;
    local_ad8.fGiven = local_ad8.fElem;
    TPZVec<int>::TPZVec(&local_ad8.fPivot.super_TPZVec<int>,0);
    local_ad8.fPivot.super_TPZVec<int>.fStore = local_ad8.fPivot.fExtAlloc;
    local_ad8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_ad8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_ad8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_ad8.fWork.fStore = (double *)0x0;
    local_ad8.fWork.fNElements = 0;
    local_ad8.fWork.fNAlloc = 0;
    local_ad8.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var11;
    if (iVar17 == 0) {
      local_ad8.fElem = (double *)0x0;
    }
    else if (0x15 < iVar13) {
      local_ad8.fElem = (double *)operator_new__(lVar19 * 8);
    }
    local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018151d8;
    local_a48.fElem = local_178;
    local_a48.fSize = 0x28;
    local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar19;
    local_a48.fGiven = local_a48.fElem;
    TPZVec<int>::TPZVec(&local_a48.fPivot.super_TPZVec<int>,0);
    local_a48.fPivot.super_TPZVec<int>.fStore = local_a48.fPivot.fExtAlloc;
    local_a48.fPivot.super_TPZVec<int>.fNElements = 0;
    local_a48.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_a48.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_a48.fWork.fStore = (double *)0x0;
    local_a48.fWork.fNElements = 0;
    local_a48.fWork.fNAlloc = 0;
    local_a48.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var11;
    if (iVar17 == 0) {
      local_a48.fElem = (double *)0x0;
    }
    else if (0x15 < iVar13) {
      local_a48.fElem = (double *)operator_new__(lVar19 << 4);
    }
    iVar8 = order->fStore[uVar14];
    transformation_index = TPZShapeLinear::GetTransformId1d(&local_9a8);
    TPZShapeLinear::ShapeInternal(&local_b20,iVar8,&local_ad8,&local_a48,transformation_index);
    TransformDerivativeFromRibToQuad((int)uVar14,iVar17,&local_a48);
    if (1 < iVar13) {
      uVar14 = uVar14 | 4;
      lVar16 = (long)(int)lVar16;
      lVar15 = 0;
      do {
        if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
           (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar15) ||
           (local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((lVar16 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16)) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[lVar16] = local_988.fElem[uVar14] * local_ad8.fElem[lVar15];
        lVar10 = 0;
        bVar7 = true;
        do {
          bVar9 = bVar7;
          if ((local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar10) ||
             (local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar14)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar15) ||
             (local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
             (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar10) ||
             (local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar15)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar6 <= lVar10) || (lVar16 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dphi->fElem[lVar6 * lVar16 + lVar10] =
               local_5d0.fElem
               [local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar14 + lVar10] *
               local_ad8.fElem[lVar15] +
               local_988.fElem[uVar14] *
               local_a48.fElem
               [local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar15 + lVar10];
          lVar10 = 1;
          bVar7 = false;
        } while (bVar9);
        lVar16 = lVar16 + 1;
        lVar15 = lVar15 + 1;
        pp_Var11 = local_ae0;
      } while (lVar15 != lVar19);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_a48);
    TPZFMatrix<double>::~TPZFMatrix(&local_ad8);
    if (local_b20.fStore != &local_b00) {
      local_b20.fNAlloc = 0;
      local_b20._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      if (local_b20.fStore != (double *)0x0) {
        operator_delete__(local_b20.fStore);
      }
    }
    local_9a8._vptr_TPZVec = local_af8;
    if (local_9a8.fStore != (long *)0x0) {
      operator_delete__(local_9a8.fStore);
    }
    uVar14 = local_9b0;
  } while (local_9b0 != 4);
  iVar13 = order->fStore[4] + -1;
  uVar18 = iVar13 * iVar13;
  uVar14 = (ulong)uVar18;
  local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_ad8.fElem = local_218;
  local_ad8.fSize = 0x14;
  local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar14;
  local_ad8.fGiven = local_ad8.fElem;
  TPZVec<int>::TPZVec(&local_ad8.fPivot.super_TPZVec<int>,0);
  local_ad8.fPivot.super_TPZVec<int>.fStore = local_ad8.fPivot.fExtAlloc;
  local_ad8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_ad8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_ad8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_ad8.fWork.fStore = (double *)0x0;
  local_ad8.fWork.fNElements = 0;
  local_ad8.fWork.fNAlloc = 0;
  local_ad8.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var11;
  if (iVar13 == 0) {
    local_ad8.fElem = (double *)0x0;
  }
  else if (0x14 < uVar18) {
    local_ad8.fElem = (double *)operator_new__(uVar14 * 8);
  }
  local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_a48.fElem = local_178;
  local_a48.fSize = 0x28;
  local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar14;
  local_a48.fGiven = local_a48.fElem;
  TPZVec<int>::TPZVec(&local_a48.fPivot.super_TPZVec<int>,0);
  local_a48.fPivot.super_TPZVec<int>.fStore = local_a48.fPivot.fExtAlloc;
  local_a48.fPivot.super_TPZVec<int>.fNElements = 0;
  local_a48.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_a48.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_a48.fWork.fStore = (double *)0x0;
  local_a48.fWork.fNElements = 0;
  local_a48.fWork.fNAlloc = 0;
  local_a48.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var11;
  if (iVar13 == 0) {
    local_a48.fElem = (double *)0x0;
  }
  else if (0x14 < uVar18) {
    local_a48.fElem = (double *)operator_new__(uVar14 << 4);
  }
  iVar17 = order->fStore[4];
  iVar8 = GetTransformId2dQ(local_af0);
  ShapeInternal(local_ae8,iVar17 + -2,&local_ad8,&local_a48,iVar8);
  if (iVar13 != 0) {
    lVar16 = (long)(int)lVar16;
    uVar14 = 1;
    if (1 < uVar18) {
      uVar14 = (ulong)uVar18;
    }
    uVar12 = 0;
    do {
      if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 9) ||
         (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
         (local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((lVar16 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar16] = local_988.fElem[8] * local_ad8.fElem[uVar12];
      lVar19 = 0;
      bVar7 = true;
      do {
        bVar9 = bVar7;
        if ((local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar19) ||
           (local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
           (local_ad8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 9) ||
           (local_988.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar19) ||
           (local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar12)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if (((lVar15 <= lVar19) || (lVar16 < 0)) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dphi->fElem[lVar15 * lVar16 + lVar19] =
             local_5d0.fElem
             [local_5d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 8 + lVar19] *
             local_ad8.fElem[uVar12] +
             local_988.fElem[8] *
             local_a48.fElem
             [local_a48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar12 + lVar19];
        lVar19 = 1;
        bVar7 = false;
      } while (bVar9);
      lVar16 = lVar16 + 1;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_a48);
  TPZFMatrix<double>::~TPZFMatrix(&local_ad8);
  TPZFMatrix<double>::~TPZFMatrix(&local_5d0,&PTR_PTR_018379a8);
  TPZFMatrix<double>::~TPZFMatrix(&local_988,&PTR_PTR_018379a8);
  return;
}

Assistant:

void TPZShapeQuad::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
                             TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        ShapeCorner(pt,phi,dphi);
        int is,d;
        TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
        for(is=0; is<NCornerNodes; is++)
        {
            phiblend(is,0) = phi(is,0);
            for(d=0; d<Dimension; d++)
            {
                dphiblend(d,is) = dphi(d,is);
            }
        }
        ShapeGenerating(pt,phiblend,dphiblend);
        REAL out;
        int shape = 4;
        for (int rib = 0; rib < 4; rib++) {
            
            ProjectPoint2dQuadToRib(rib,pt,out);
            TPZVec<int64_t> ids(2);
            TPZManVector<REAL,1> outvec(1,out);
            ids[0] = id[rib%4];
            ids[1] = id[(rib+1)%4];
            REAL store1[20],store2[40];
            int ord2 = order[rib]-1;//two orders : order in x and order in y
            TPZFMatrix<REAL> phin(ord2,1,store1,20),dphin(2,ord2,store2,40);
            TPZShapeLinear::ShapeInternal(outvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));
            TransformDerivativeFromRibToQuad(rib,ord2,dphin);
            for (int i = 0; i < ord2; i++) {
                phi(shape,0) = phiblend(rib+4,0)*phin(i,0);
                for(int xj=0;xj<2;xj++) {
                    dphi(xj,shape) = dphiblend(xj,rib+4)*phin(i,0)+
                    phiblend(rib+4,0)*dphin(xj,i);
                }
                shape++;
            }
        }
        REAL store1[20],store2[40];
        int ord = (order[4]-1)*(order[4]-1);
        TPZFMatrix<REAL> phin(ord,1,store1,20),dphin(2,ord,store2,40);
        ShapeInternal(pt,order[4]-2,phin,dphin,GetTransformId2dQ(id));
        for(int i=0;i<ord;i++)    {//funcoes de interior s�o em numero ordem-1
            phi(shape,0) = phiblend(8,0)*phin(i,0);
            for(int xj=0;xj<2;xj++) {//x e y
                dphi(xj,shape) = dphiblend(xj,8)*phin(i,0) +
                phiblend(8,0)*dphin(xj,i);
            }
            shape++;
        }
    }